

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QCborValue * qvariant_cast<QCborValue>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QCborValue *t;
  QMetaType in_stack_00000058;
  QMetaType targetType;
  QCborValue *in_stack_ffffffffffffff88;
  QCborValue *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaType::fromType<QCborValue>();
  QVariant::Private::type((Private *)in_stack_ffffffffffffff90);
  bVar2 = operator==((QMetaType *)in_stack_ffffffffffffff90,(QMetaType *)in_stack_ffffffffffffff88);
  if (bVar2) {
    QVariant::Private::get<QCborValue>((Private *)0x48d521);
    QCborValue::QCborValue(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    *(undefined1 **)&in_RDI->t = &DAT_aaaaaaaaaaaaaaaa;
    in_RDI->n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    in_RDI->container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QCborValue::QCborValue((QCborValue *)in_RDI);
    QVariant::metaType((QVariant *)in_stack_ffffffffffffff88);
    QVariant::constData((QVariant *)0x48d57f);
    QMetaType::convert(in_stack_00000058,in_stack_ffffffffffffffb8,(QMetaType)t,
                       in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}